

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O1

gpointer g_hash_table_lookup(GHashTable *hash_table,gconstpointer key)

{
  guint gVar1;
  gboolean gVar2;
  GHashNode *pGVar3;
  gpointer pvVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  if (hash_table == (GHashTable *)0x0) {
    return (gpointer)0x0;
  }
  gVar1 = (*hash_table->hash_func)(key);
  uVar5 = 2;
  if (2 < gVar1) {
    uVar5 = (ulong)gVar1;
  }
  uVar7 = uVar5 % (ulong)(uint)hash_table->mod;
  gVar1 = hash_table->nodes[uVar7].key_hash;
  if (gVar1 != 0) {
    pGVar3 = hash_table->nodes + uVar7;
    iVar6 = 1;
    do {
      if (gVar1 == (guint)uVar5) {
        if (hash_table->key_equal_func == (GEqualFunc)0x0) {
          if (pGVar3->key == key) break;
        }
        else {
          gVar2 = (*hash_table->key_equal_func)(pGVar3->key,key);
          if (gVar2 != 0) break;
        }
      }
      uVar7 = (ulong)((int)uVar7 + iVar6 & hash_table->mask);
      pGVar3 = hash_table->nodes + uVar7;
      gVar1 = pGVar3->key_hash;
      iVar6 = iVar6 + 1;
    } while (gVar1 != 0);
  }
  if (hash_table->nodes[uVar7].key_hash == 0) {
    pvVar4 = (gpointer)0x0;
  }
  else {
    pvVar4 = hash_table->nodes[uVar7].value;
  }
  return pvVar4;
}

Assistant:

gpointer g_hash_table_lookup (GHashTable   *hash_table,
        gconstpointer key)
{
    GHashNode *node;
    guint      node_index;

    if (hash_table == NULL) return NULL;

    node_index = g_hash_table_lookup_node (hash_table, key);
    node = &hash_table->nodes [node_index];

    return node->key_hash ? node->value : NULL;
}